

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsInvalidTest::getValueList_abi_cxx11_
          (string *__return_storage_ptr__,ImplicitConversionsInvalidTest *this,GLuint n_rows)

{
  undefined4 local_24;
  GLuint i;
  GLuint n_rows_local;
  ImplicitConversionsInvalidTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_24 = 0; local_24 < n_rows; local_24 = local_24 + 1) {
    if (local_24 == n_rows - 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImplicitConversionsInvalidTest::getValueList(glw::GLuint n_rows)
{
	std::string result;

	for (GLuint i = 0; i < n_rows; ++i)
	{
		if (i != n_rows - 1)
		{
			result.append("1, ");
		}
		else
		{
			result.append("1");
		}
	}

	return result;
}